

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O3

ostream * operator<<(ostream *os,
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *property)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(property->first)._M_dataplus._M_p,(property->first)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(property->second)._M_dataplus._M_p,(property->second)._M_string_length);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::pair<const std::string, std::string> &property) {
  os << std::get<0>(property) << " = " << std::get<1>(property);
  return os;
}